

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::inc_refcount
          (piece_picker *this,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *bitmask,torrent_peer *peer)

{
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> idx;
  prio_index_t elem_index;
  undefined1 auVar1 [16];
  long lVar2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *first;
  piece_picker *ppVar3;
  undefined4 idx_00;
  torrent_peer *ptVar4;
  bool bVar5;
  int iVar6;
  size_type sVar7;
  int *piVar8;
  long lVar9;
  unsigned_long uVar10;
  ulong uVar11;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *psVar12;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *last;
  value_type *this_00;
  const_iterator cVar13;
  undefined8 uStack_1a0;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> asStack_198 [2];
  value_type *local_190;
  int local_188;
  int local_184;
  value_type *local_180;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_178;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_170;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_168;
  int local_15c;
  piece_picker *local_158;
  undefined4 local_14c;
  uint32_t *local_148;
  uint32_t local_140;
  undefined1 local_138 [8];
  const_iterator end_1;
  undefined1 local_118 [8];
  const_iterator i_2;
  bool updated;
  piece_index_t index;
  int new_priority;
  int prev_priority;
  piece_pos *p;
  int local_d8;
  piece_index_t piece;
  int i_1;
  undefined1 local_b8 [8];
  const_iterator end;
  undefined1 local_98 [8];
  const_iterator i;
  int num_inc;
  piece_index_t index_1;
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  incremented_destructor;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_68;
  piece_index_t *TORRENT_ALLOCA_tmp;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *local_50;
  long local_48;
  long TORRENT_ALLOCA_size;
  span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> incremented;
  int local_28;
  int local_24;
  torrent_peer *ptStack_20;
  int size;
  torrent_peer *peer_local;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *bitmask_local;
  piece_picker *this_local;
  
  psVar12 = asStack_198;
  uStack_1a0 = 0x50983b;
  local_158 = this;
  ptStack_20 = peer;
  peer_local = (torrent_peer *)bitmask;
  bitmask_local =
       (typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
        *)this;
  bVar5 = bitfield::none_set(&bitmask->super_bitfield);
  if (bVar5) {
    return;
  }
  uStack_1a0 = 0x50984f;
  bVar5 = bitfield::all_set((bitfield *)peer_local);
  if (bVar5) {
    uStack_1a0 = 0x50985e;
    local_15c = bitfield::size((bitfield *)peer_local);
    uStack_1a0 = 0x509870;
    sVar7 = ::std::
            vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
            ::size((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    *)local_158);
    if (local_15c == (int)sVar7) {
      uStack_1a0 = 0x50988d;
      inc_refcount_all(local_158,ptStack_20);
      return;
    }
  }
  local_28 = 0x32;
  uStack_1a0 = 0x5098a2;
  iVar6 = bitfield::size((bitfield *)peer_local);
  incremented.m_len._4_4_ = iVar6 / 2;
  uStack_1a0 = 0x5098ba;
  piVar8 = ::std::min<int>(&local_28,(int *)((long)&incremented.m_len + 4));
  local_24 = *piVar8;
  uStack_1a0 = 0x5098c8;
  span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::span
            ((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> *)
             &TORRENT_ALLOCA_size);
  uStack_1a0 = 0x5098d0;
  lVar9 = numeric_cast<long,int,void>(local_24);
  local_48 = lVar9;
  if (lVar9 < 0x401) {
    if (0 < local_24) {
      lVar2 = -((long)local_24 * 4 + 0xfU & 0xfffffffffffffff0);
      psVar12 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                ((long)asStack_198 + lVar2);
      *(undefined8 *)((long)asStack_198 + lVar2 + -8) = 0x50995d;
      span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::span
                ((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  *)&incremented_destructor.objects.m_len,psVar12,lVar9);
      TORRENT_ALLOCA_size = incremented_destructor.objects.m_len;
      incremented.m_ptr = local_68;
      *(undefined8 *)((long)asStack_198 + lVar2 + -8) = 0x509976;
      local_168 = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  ::begin((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                           *)&TORRENT_ALLOCA_size);
      *(undefined8 *)((long)asStack_198 + lVar2 + -8) = 0x509986;
      last = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
             end((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                  *)&TORRENT_ALLOCA_size);
      first = local_168;
      *(undefined8 *)((long)asStack_198 + lVar2 + -8) = 0x509995;
      uninitialized_default_construct<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>*>
                (first,last);
    }
  }
  else {
    uStack_1a0 = 0x5098e6;
    uVar10 = numeric_cast<unsigned_long,int,void>(local_24);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    uVar11 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar11 = 0xffffffffffffffff;
    }
    uStack_1a0 = 0x509907;
    psVar12 = (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)operator_new__(uVar11);
    uStack_1a0 = 0x509917;
    span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::span
              ((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                *)&TORRENT_ALLOCA_tmp,psVar12,local_48);
    TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
    incremented.m_ptr = local_50;
    psVar12 = asStack_198;
  }
  *(undefined8 *)(psVar12 + -2) = 0x5099a4;
  span<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>::
  span<libtorrent::span<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,void>
            ((span<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>> *)
             &num_inc,(span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                       *)&TORRENT_ALLOCA_size);
  ptVar4 = peer_local;
  if ((local_158->m_dirty & 1U) == 0) {
    i._12_4_ = 0;
    i.bit = 0;
    *(undefined8 *)(psVar12 + -2) = 0x5099cf;
    cVar13 = bitfield::begin((bitfield *)ptVar4);
    ptVar4 = peer_local;
    end._8_8_ = cVar13.buf;
    i.buf._0_4_ = cVar13.bit;
    local_98 = (undefined1  [8])end._8_8_;
    *(undefined8 *)(psVar12 + -2) = 0x5099ff;
    cVar13 = bitfield::end((bitfield *)ptVar4);
    local_b8 = (undefined1  [8])cVar13.buf;
    end.buf._0_4_ = cVar13.bit;
    while( true ) {
      *(undefined8 *)(psVar12 + -2) = 0x509a39;
      bVar5 = bitfield::const_iterator::operator!=
                        ((const_iterator *)local_98,(const_iterator *)local_b8);
      if (!bVar5) break;
      *(undefined8 *)(psVar12 + -2) = 0x509a4e;
      bVar5 = bitfield::const_iterator::operator*((const_iterator *)local_98);
      if (bVar5) {
        if ((int)i.bit < local_24) {
          lVar9 = (long)(int)i.bit;
          *(undefined8 *)(psVar12 + -2) = 0x509a69;
          local_170 = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      ::operator[]((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                                    *)&TORRENT_ALLOCA_size,lVar9);
          local_170->m_val = i._12_4_;
        }
        i.bit = i.bit + 1;
        if (local_24 <= (int)i.bit) break;
      }
      *(undefined8 *)(psVar12 + -2) = 0x509ac1;
      bitfield::const_iterator::operator++((const_iterator *)local_98);
      *(undefined8 *)(psVar12 + -2) = 0x509aca;
      strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&i.field_0xc);
    }
    if ((int)i.bit < local_24) {
      for (local_d8 = 0; local_d8 < (int)i.bit; local_d8 = local_d8 + 1) {
        *(undefined8 *)(psVar12 + -2) = 0x509b06;
        local_178 = span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                    ::operator[]((span<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                                  *)&TORRENT_ALLOCA_size,(long)local_d8);
        ppVar3 = local_158;
        idx.m_val = local_178->m_val;
        *(undefined8 *)(psVar12 + -2) = 0x509b3c;
        this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
                  ::operator[](&ppVar3->m_piece_map,idx);
        ppVar3 = local_158;
        local_180 = this_00;
        *(undefined8 *)(psVar12 + -2) = 0x509b66;
        iVar6 = piece_pos::priority(this_00,ppVar3);
        ppVar3 = local_158;
        *(uint *)this_00 = *(uint *)this_00 & 0xfc000000 | *(uint *)this_00 + 1 & 0x3ffffff;
        local_184 = iVar6;
        *(undefined8 *)(psVar12 + -2) = 0x509baa;
        local_188 = piece_pos::priority(this_00,ppVar3);
        ppVar3 = local_158;
        if (iVar6 != local_188) {
          if (iVar6 < 0) {
            *(undefined8 *)(psVar12 + -2) = 0x509c21;
            add(ppVar3,(piece_index_t)idx.m_val);
          }
          else {
            elem_index.m_val = (this_00->index).m_val;
            *(undefined8 *)(psVar12 + -2) = 0x509bff;
            update(ppVar3,iVar6,elem_index);
          }
        }
      }
      goto LAB_00509d9d;
    }
  }
  ptVar4 = peer_local;
  i_2._12_4_ = 0;
  i_2.bit._3_1_ = 0;
  *(undefined8 *)(psVar12 + -2) = 0x509c68;
  cVar13 = bitfield::begin((bitfield *)ptVar4);
  ptVar4 = peer_local;
  end_1._8_8_ = cVar13.buf;
  i_2.buf._0_4_ = cVar13.bit;
  local_118 = (undefined1  [8])end_1._8_8_;
  *(undefined8 *)(psVar12 + -2) = 0x509c98;
  cVar13 = bitfield::end((bitfield *)ptVar4);
  local_148 = cVar13.buf;
  local_140 = cVar13.bit;
  local_138 = (undefined1  [8])local_148;
  end_1.buf._0_4_ = local_140;
  while( true ) {
    *(undefined8 *)(psVar12 + -2) = 0x509cd2;
    bVar5 = bitfield::const_iterator::operator!=
                      ((const_iterator *)local_118,(const_iterator *)local_138);
    if (!bVar5) break;
    *(undefined8 *)(psVar12 + -2) = 0x509ce7;
    bVar5 = bitfield::const_iterator::operator*((const_iterator *)local_118);
    idx_00 = i_2._12_4_;
    ppVar3 = local_158;
    if (bVar5) {
      local_14c = i_2._12_4_;
      *(undefined8 *)(psVar12 + -2) = 0x509d0b;
      local_190 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
                  ::operator[](&ppVar3->m_piece_map,
                               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)idx_00);
      *(uint *)local_190 =
           *(uint *)local_190 & 0xfc000000 | (*(uint *)local_190 & 0x3ffffff) + 1 & 0x3ffffff;
      i_2.bit._3_1_ = 1;
    }
    *(undefined8 *)(psVar12 + -2) = 0x509d4d;
    bitfield::const_iterator::operator++((const_iterator *)local_118);
    *(undefined8 *)(psVar12 + -2) = 0x509d59;
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&i_2.field_0xc);
  }
  if (((local_158->m_dirty & 1U) == 0) && ((i_2.bit._3_1_ & 1) != 0)) {
    local_158->m_dirty = true;
  }
LAB_00509d9d:
  *(undefined8 *)(psVar12 + -2) = 0x509da6;
  alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>::
  ~alloca_destructor((alloca_destructor<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                      *)&num_inc);
  return;
}

Assistant:

void piece_picker::inc_refcount(typed_bitfield<piece_index_t> const& bitmask
		, const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "inc_refcount(bitfield)" << std::endl;
#endif

		// nothing set, nothing to do here
		if (bitmask.none_set()) return;

		if (bitmask.all_set() && bitmask.size() == int(m_piece_map.size()))
		{
			inc_refcount_all(peer);
			return;
		}

		int const size = std::min(50, int(bitmask.size() / 2));

		// this is an optimization where if just a few
		// pieces end up changing, instead of making
		// the piece list dirty, just update those pieces
		// instead
		TORRENT_ALLOCA(incremented, piece_index_t, size);

		if (!m_dirty)
		{
			// first count how many pieces we're updating. If it's few (less than half)
			// we'll just update them one at a time. Otherwise we'll just update the counters
			// and mark the picker as dirty, so we'll rebuild it next time we need it.
			// this only matters if we're not already dirty, in which case the fasted
			// thing to do is to just update the counters and be done
			piece_index_t index{0};
			int num_inc = 0;
			for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
			{
				if (!*i) continue;
				if (num_inc < size) incremented[num_inc] = index;
				++num_inc;
				if (num_inc >= size) break;
			}

			if (num_inc < size)
			{
				// not that many pieces were updated
				// just update those individually instead of
				// rebuilding the whole piece list
				for (int i = 0; i < num_inc; ++i)
				{
					piece_index_t const piece = incremented[i];
					piece_pos& p = m_piece_map[piece];
					int prev_priority = p.priority(this);
					++p.peer_count;
#ifdef TORRENT_DEBUG_REFCOUNTS
					TORRENT_ASSERT(p.have_peers.count(peer) == 0);
					p.have_peers.insert(peer);
#else
					TORRENT_UNUSED(peer);
#endif
					int new_priority = p.priority(this);
					if (prev_priority == new_priority) continue;
					else if (prev_priority >= 0) update(prev_priority, p.index);
					else add(piece);
				}
				return;
			}
		}

		piece_index_t index{0};
		bool updated = false;
		for (auto i = bitmask.begin(), end(bitmask.end()); i != end; ++i, ++index)
		{
			if (*i)
			{
#ifdef TORRENT_DEBUG_REFCOUNTS
				TORRENT_ASSERT(m_piece_map[index].have_peers.count(peer) == 0);
				m_piece_map[index].have_peers.insert(peer);
#else
				TORRENT_UNUSED(peer);
#endif

				++m_piece_map[index].peer_count;
				updated = true;
			}
		}

		// if we're already dirty, no point in doing anything more
		if (m_dirty) return;

		if (updated) m_dirty = true;
	}